

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ext_dma.c
# Opt level: O0

MPP_RET allocator_ext_dma_mmap(void *ctx,MppBufferInfo *info)

{
  uint uVar1;
  void *pvVar2;
  unsigned_long offset;
  int flags;
  void *ptr;
  MppBufferInfo *info_local;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx",
                 "allocator_ext_dma_mmap",0x5d), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((info->size == 0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->size",
                 "allocator_ext_dma_mmap",0x5e), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((info->fd < 0) &&
     (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->fd >= 0",
                 "allocator_ext_dma_mmap",0x5f), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (info->ptr == (void *)0x0) {
    offset._4_4_ = 1;
    uVar1 = fcntl64(info->fd,3);
    if ((uVar1 & 2) != 0) {
      offset._4_4_ = 3;
    }
    pvVar2 = mmap64((void *)0x0,info->size,offset._4_4_,1,info->fd,0);
    if (pvVar2 == (void *)0xffffffffffffffff) {
      ctx_local._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      info->ptr = pvVar2;
      ctx_local._4_4_ = MPP_OK;
    }
  }
  else {
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET allocator_ext_dma_mmap(void *ctx, MppBufferInfo *info)
{
    void *ptr = NULL;
    int flags = 0;
    unsigned long offset = 0L;
    mpp_assert(ctx);
    mpp_assert(info->size);
    mpp_assert(info->fd >= 0);

    if (info->ptr)
        return MPP_OK;

    /*
     * It is insecure to access the first memory page,
     * usually system doesn't allow this behavior.
     */
    flags = PROT_READ;
    if (fcntl(info->fd, F_GETFL) & O_RDWR)
        flags |= PROT_WRITE;

    ptr = mmap(NULL, info->size, flags, MAP_SHARED, info->fd, offset);
    if (ptr == MAP_FAILED)
        return MPP_ERR_NULL_PTR;

    info->ptr = ptr;

    return MPP_OK;
}